

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmForEachCommand.cxx
# Opt level: O1

bool cmForEachCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *args,cmExecutionStatus *status)

{
  cmList *this;
  cmFunctionBlocker *this_00;
  pointer pbVar1;
  pointer pbVar2;
  cmMakefile *this_01;
  int iVar3;
  char cVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var8;
  long *plVar9;
  string *psVar10;
  _Head_base<0UL,_cmFunctionBlocker_*,_false> _Var11;
  ulong uVar12;
  long lVar13;
  value_type *__x;
  char cVar14;
  undefined8 uVar15;
  _Alloc_hider _Var16;
  undefined8 in_R9;
  ulong uVar17;
  uint uVar18;
  string *__x_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  anon_class_16_2_5155b745 __gen;
  string_view value;
  int start;
  int cc;
  string __str_1;
  string __str;
  string local_110;
  long *local_f0;
  string local_e8;
  long *local_c8;
  long **local_c0;
  size_type local_b8;
  pointer local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  long *local_98;
  long **local_90;
  __uniq_ptr_impl<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_> local_88;
  long *local_80;
  uint local_78;
  undefined4 uStack_74;
  long local_70 [2];
  long *local_60;
  uint local_58;
  undefined4 uStack_54;
  long local_50 [2];
  long local_40;
  ulong local_38;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar1 == pbVar2) {
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"called with incorrect number of arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,(ulong)(local_e8.field_2._M_allocated_capacity + 1))
      ;
    }
    return false;
  }
  _Var8 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[3]>>
                    (pbVar1,pbVar2,"IN");
  this_01 = status->Makefile;
  if (_Var8._M_current !=
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    plVar9 = (long *)operator_new(200);
    plVar9[1] = (long)(plVar9 + 3);
    plVar9[2] = 0;
    *(undefined1 *)(plVar9 + 3) = 0;
    plVar9[5] = (long)(plVar9 + 7);
    plVar9[6] = 0;
    *(undefined1 *)(plVar9 + 7) = 0;
    plVar9[9] = 0;
    *(undefined1 *)(plVar9 + 0xe) = 0;
    plVar9[0xf] = 0;
    plVar9[0x10] = 0;
    plVar9[0x11] = 0;
    *(undefined4 *)(plVar9 + 0x12) = 1;
    *plVar9 = (long)&PTR__cmForEachFunctionBlocker_00bdf3f0;
    this = (cmList *)(plVar9 + 0x13);
    plVar9[0x13] = 0;
    plVar9[0x14] = 0;
    plVar9[0x15] = 0;
    plVar9[0x16] = (long)this_01;
    plVar9[0x17] = 0;
    *(undefined1 *)(plVar9 + 0x18) = 0;
    cmMakefile::PushLoopBlock(this_01);
    __x = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
    lVar13 = (long)_Var8._M_current - (long)__x >> 5;
    local_f0 = plVar9;
    if (0 < lVar13) {
      lVar13 = lVar13 + 1;
      do {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)this,__x);
        __x = __x + 1;
        lVar13 = lVar13 + -1;
      } while (1 < lVar13);
    }
    local_40 = plVar9[0x14] - plVar9[0x13];
    local_38 = local_40 >> 5;
    plVar9[0x17] = local_38;
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    uVar18 = 0;
    do {
      __x_00 = _Var8._M_current + 1;
      if (__x_00 == pbVar1) break;
      iVar6 = std::__cxx11::string::compare((char *)__x_00);
      if (iVar6 == 0) {
        if (uVar18 != 3) {
          if (local_40 == 0x20) {
            uVar18 = 1;
            goto LAB_004702fe;
          }
          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          local_110._M_dataplus._M_p = (char *)0x35;
          local_e8._M_dataplus._M_p =
               (pointer)std::__cxx11::string::_M_create((ulong *)&local_e8,(ulong)&local_110);
          local_e8.field_2._M_allocated_capacity = (size_type)local_110._M_dataplus._M_p;
          builtin_strncpy(local_e8._M_dataplus._M_p,
                          "ITEMS or LISTS require exactly one iteration variable",0x35);
          local_e8._M_string_length = (size_type)local_110._M_dataplus._M_p;
          local_e8._M_dataplus._M_p[(long)local_110._M_dataplus._M_p] = '\0';
          cmMakefile::IssueMessage(this_01,FATAL_ERROR,&local_e8);
          goto LAB_004702cc;
        }
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        local_110._M_dataplus._M_p = (char *)0x2d;
        local_e8._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_e8,(ulong)&local_110);
        local_e8.field_2._M_allocated_capacity = (size_type)local_110._M_dataplus._M_p;
        builtin_strncpy(local_e8._M_dataplus._M_p,"ZIP_LISTS can not be used with LISTS or ITEMS",
                        0x2d);
        local_e8._M_string_length = (size_type)local_110._M_dataplus._M_p;
        local_e8._M_dataplus._M_p[(long)local_110._M_dataplus._M_p] = '\0';
        cmMakefile::IssueMessage(this_01,FATAL_ERROR,&local_e8);
LAB_00470015:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,
                          (ulong)(local_e8.field_2._M_allocated_capacity + 1));
        }
        uVar18 = 3;
LAB_004702e8:
        bVar5 = false;
      }
      else {
        iVar6 = std::__cxx11::string::compare((char *)__x_00);
        if (iVar6 == 0) {
          if (uVar18 == 3) {
            local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
            local_110._M_dataplus._M_p = (char *)0x2d;
            local_e8._M_dataplus._M_p =
                 (pointer)std::__cxx11::string::_M_create((ulong *)&local_e8,(ulong)&local_110);
            local_e8.field_2._M_allocated_capacity = (size_type)local_110._M_dataplus._M_p;
            builtin_strncpy(local_e8._M_dataplus._M_p,
                            "ZIP_LISTS can not be used with LISTS or ITEMS",0x2d);
            local_e8._M_string_length = (size_type)local_110._M_dataplus._M_p;
            local_e8._M_dataplus._M_p[(long)local_110._M_dataplus._M_p] = '\0';
            cmMakefile::IssueMessage(this_01,FATAL_ERROR,&local_e8);
            goto LAB_00470015;
          }
          if (local_40 == 0x20) {
            uVar18 = 2;
            goto LAB_004702fe;
          }
          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          local_110._M_dataplus._M_p = (char *)0x35;
          local_e8._M_dataplus._M_p =
               (pointer)std::__cxx11::string::_M_create((ulong *)&local_e8,(ulong)&local_110);
          local_e8.field_2._M_allocated_capacity = (size_type)local_110._M_dataplus._M_p;
          builtin_strncpy(local_e8._M_dataplus._M_p,
                          "ITEMS or LISTS require exactly one iteration variable",0x35);
          local_e8._M_string_length = (size_type)local_110._M_dataplus._M_p;
          local_e8._M_dataplus._M_p[(long)local_110._M_dataplus._M_p] = '\0';
          cmMakefile::IssueMessage(this_01,FATAL_ERROR,&local_e8);
LAB_004702cc:
          uVar15 = local_e8.field_2._M_allocated_capacity;
          _Var16._M_p = local_e8._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
LAB_004702e0:
            operator_delete(_Var16._M_p,(ulong)(uVar15 + 1));
          }
          goto LAB_004702e8;
        }
        iVar6 = std::__cxx11::string::compare((char *)__x_00);
        if (iVar6 == 0) {
          if (uVar18 != 0) {
            local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
            local_110._M_dataplus._M_p = (char *)0x2d;
            local_e8._M_dataplus._M_p =
                 (pointer)std::__cxx11::string::_M_create((ulong *)&local_e8,(ulong)&local_110);
            local_e8.field_2._M_allocated_capacity = (size_type)local_110._M_dataplus._M_p;
            builtin_strncpy(local_e8._M_dataplus._M_p,
                            "ZIP_LISTS can not be used with LISTS or ITEMS",0x2d);
            local_e8._M_string_length = (size_type)local_110._M_dataplus._M_p;
            local_e8._M_dataplus._M_p[(long)local_110._M_dataplus._M_p] = '\0';
            cmMakefile::IssueMessage(this_01,FATAL_ERROR,&local_e8);
            goto LAB_004702cc;
          }
          *(undefined1 *)(local_f0 + 0x18) = 1;
          uVar18 = 3;
LAB_004702fe:
          bVar5 = true;
        }
        else if (uVar18 == 1) {
          psVar10 = cmMakefile::GetSafeDefinition(this_01,__x_00);
          bVar5 = true;
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              psVar10->_M_string_length ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            uVar18 = 1;
          }
          else {
            uVar18 = 1;
            value._M_str = &DAT_00000001;
            value._M_len = (size_t)(psVar10->_M_dataplus)._M_p;
            cmList::insert(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_f0[0x14],
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           psVar10->_M_string_length,value,(EmptyElements)in_R9);
          }
        }
        else {
          if ((uVar18 & 0xfffffffe) != 2) {
            local_e8._M_dataplus._M_p = (char *)0x12;
            local_e8._M_string_length = 0x959d49;
            local_e8.field_2._M_allocated_capacity = 0;
            local_e8.field_2._8_8_ = 2;
            local_c8 = (long *)0x925095;
            local_c0 = (long **)0x0;
            local_b0 = (__x_00->_M_dataplus)._M_p;
            local_b8 = _Var8._M_current[1]._M_string_length;
            local_a8 = 0;
            local_a0 = 1;
            local_98 = (long *)0x97179e;
            local_90 = (long **)0x0;
            views._M_len = 4;
            views._M_array = (iterator)&local_e8;
            cmCatViews(&local_110,views);
            cmMakefile::IssueMessage(this_01,FATAL_ERROR,&local_110);
            uVar15 = local_110.field_2._M_allocated_capacity;
            _Var16._M_p = local_110._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_110._M_dataplus._M_p == &local_110.field_2) goto LAB_004702e8;
            goto LAB_004702e0;
          }
          bVar5 = true;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)this,__x_00);
        }
      }
      _Var8._M_current = __x_00;
    } while (bVar5);
    uVar17 = local_38;
    plVar9 = local_f0;
    if (__x_00 == pbVar1) {
      if ((local_38 < 2 || uVar18 != 3) || (local_40 >> 4 == local_f0[0x14] - local_f0[0x13] >> 5))
      {
        local_e8._M_dataplus._M_p = (pointer)local_f0;
        cmMakefile::AddFunctionBlocker
                  (this_01,(unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_> *
                           )&local_e8);
        if ((long *)local_e8._M_dataplus._M_p != (long *)0x0) {
          (**(code **)(*(long *)local_e8._M_dataplus._M_p + 8))();
        }
        local_e8._M_dataplus._M_p = (char *)0x0;
        plVar9 = (long *)0x0;
      }
      else {
        cVar14 = '\x01';
        if (9 < local_38) {
          uVar12 = local_38;
          cVar4 = '\x04';
          do {
            cVar14 = cVar4;
            if (uVar12 < 100) {
              cVar14 = cVar14 + -2;
              goto LAB_004706a8;
            }
            if (uVar12 < 1000) {
              cVar14 = cVar14 + -1;
              goto LAB_004706a8;
            }
            if (uVar12 < 10000) goto LAB_004706a8;
            bVar5 = 99999 < uVar12;
            uVar12 = uVar12 / 10000;
            cVar4 = cVar14 + '\x04';
          } while (bVar5);
          cVar14 = cVar14 + '\x01';
        }
LAB_004706a8:
        local_60 = local_50;
        std::__cxx11::string::_M_construct((ulong)&local_60,cVar14);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_60,local_58,uVar17);
        uVar17 = (plVar9[0x14] - plVar9[0x13] >> 5) - uVar17;
        cVar14 = '\x01';
        if (9 < uVar17) {
          uVar12 = uVar17;
          cVar4 = '\x04';
          do {
            cVar14 = cVar4;
            if (uVar12 < 100) {
              cVar14 = cVar14 + -2;
              goto LAB_0047074e;
            }
            if (uVar12 < 1000) {
              cVar14 = cVar14 + -1;
              goto LAB_0047074e;
            }
            if (uVar12 < 10000) goto LAB_0047074e;
            bVar5 = 99999 < uVar12;
            uVar12 = uVar12 / 10000;
            cVar4 = cVar14 + '\x04';
          } while (bVar5);
          cVar14 = cVar14 + '\x01';
        }
LAB_0047074e:
        local_80 = local_70;
        std::__cxx11::string::_M_construct((ulong)&local_80,cVar14);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_80,local_78,uVar17);
        local_e8._M_dataplus._M_p = (char *)0x9;
        local_e8._M_string_length = 0x90687c;
        local_e8.field_2._M_allocated_capacity = 0;
        local_e8.field_2._8_8_ = CONCAT44(uStack_54,local_58);
        local_c8 = local_60;
        local_b8 = 0x1b;
        local_b0 = " list variables, but given ";
        local_a8 = 0;
        local_a0 = CONCAT44(uStack_74,local_78);
        local_98 = local_80;
        views_00._M_len = 4;
        views_00._M_array = (iterator)&local_e8;
        local_c0 = &local_60;
        local_90 = &local_80;
        cmCatViews(&local_110,views_00);
        cmMakefile::IssueMessage(this_01,FATAL_ERROR,&local_110);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,
                          (ulong)(local_110.field_2._M_allocated_capacity + 1));
        }
        if (local_80 != local_70) {
          operator_delete(local_80,local_70[0] + 1);
        }
        plVar9 = local_f0;
        if (local_60 != local_50) {
          operator_delete(local_60,local_50[0] + 1);
        }
      }
    }
    if (plVar9 != (long *)0x0) {
      (**(code **)(*plVar9 + 8))(plVar9);
    }
    return true;
  }
  _Var11._M_head_impl = (cmFunctionBlocker *)operator_new(200);
  ((_Var11._M_head_impl)->StartingContext).Name._M_dataplus._M_p =
       (pointer)&((_Var11._M_head_impl)->StartingContext).Name.field_2;
  ((_Var11._M_head_impl)->StartingContext).Name._M_string_length = 0;
  ((_Var11._M_head_impl)->StartingContext).Name.field_2._M_local_buf[0] = '\0';
  ((_Var11._M_head_impl)->StartingContext).FilePath._M_dataplus._M_p =
       (pointer)&((_Var11._M_head_impl)->StartingContext).FilePath.field_2;
  ((_Var11._M_head_impl)->StartingContext).FilePath._M_string_length = 0;
  ((_Var11._M_head_impl)->StartingContext).FilePath.field_2._M_local_buf[0] = '\0';
  ((_Var11._M_head_impl)->StartingContext).Line = 0;
  ((_Var11._M_head_impl)->StartingContext).DeferId.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  ((_Var11._M_head_impl)->Functions).
  super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ((_Var11._M_head_impl)->Functions).
  super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ((_Var11._M_head_impl)->Functions).
  super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (_Var11._M_head_impl)->ScopeDepth = 1;
  (_Var11._M_head_impl)->_vptr_cmFunctionBlocker =
       (_func_int **)&PTR__cmForEachFunctionBlocker_00bdf3f0;
  this_00 = _Var11._M_head_impl + 1;
  _Var11._M_head_impl[1]._vptr_cmFunctionBlocker = (_func_int **)0x0;
  _Var11._M_head_impl[1].StartingContext.Name._M_dataplus._M_p = (pointer)0x0;
  _Var11._M_head_impl[1].StartingContext.Name._M_string_length = 0;
  *(cmMakefile **)&_Var11._M_head_impl[1].StartingContext.Name.field_2 = this_01;
  *(undefined8 *)((long)&_Var11._M_head_impl[1].StartingContext.Name.field_2 + 8) = 0;
  *(undefined1 *)&_Var11._M_head_impl[1].StartingContext.FilePath._M_dataplus._M_p = 0;
  cmMakefile::PushLoopBlock(this_01);
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (((ulong)((long)(args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x21) ||
     (iVar6 = std::__cxx11::string::compare((char *)(pbVar1 + 1)), iVar6 != 0)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this_00,args);
LAB_00470434:
    *(undefined8 *)((long)&_Var11._M_head_impl[1].StartingContext.Name.field_2 + 8) = 1;
    local_88._M_t.
    super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
    super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl =
         (tuple<cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>)
         (tuple<cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>)_Var11._M_head_impl;
    cmMakefile::AddFunctionBlocker
              (status->Makefile,
               (unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_> *)&local_88);
    if ((_Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>)
        local_88._M_t.
        super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
        super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl != (cmFunctionBlocker *)0x0)
    {
      (**(code **)(*(long *)local_88._M_t.
                            super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                            .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 8))();
    }
    local_88._M_t.
    super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
    super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl =
         (tuple<cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>)
         (_Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>)0x0;
    bVar5 = true;
    _Var11._M_head_impl = (cmFunctionBlocker *)0x0;
  }
  else {
    local_110._M_dataplus._M_p = local_110._M_dataplus._M_p & 0xffffffff00000000;
    local_60 = (long *)((ulong)local_60 & 0xffffffff00000000);
    local_80 = (long *)((ulong)local_80 & 0xffffffff00000000);
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (((((long)(args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 != 0x60) ||
         (bVar5 = anon_unknown.dwarf_189074c::TryParseInteger(status,pbVar1 + 2,(int *)&local_60),
         bVar5)) &&
        ((pbVar1 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start,
         (long)(args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 != 0x80 ||
         ((bVar5 = anon_unknown.dwarf_189074c::TryParseInteger(status,pbVar1 + 2,(int *)&local_110),
          bVar5 && (bVar5 = anon_unknown.dwarf_189074c::TryParseInteger
                                      (status,(args->
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              )._M_impl.super__Vector_impl_data._M_start + 3,
                                       (int *)&local_60), bVar5)))))) &&
       ((pbVar1 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start,
        (long)(args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 != 0xa0 ||
        (((bVar5 = anon_unknown.dwarf_189074c::TryParseInteger(status,pbVar1 + 2,(int *)&local_110),
          bVar5 && (bVar5 = anon_unknown.dwarf_189074c::TryParseInteger
                                      (status,(args->
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              )._M_impl.super__Vector_impl_data._M_start + 3,
                                       (int *)&local_60), bVar5)) &&
         (bVar5 = anon_unknown.dwarf_189074c::TryParseInteger
                            (status,(args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + 4,(int *)&local_80)
         , bVar5)))))) {
      if ((int)local_80 == 0) {
        if ((int)local_60 < (int)local_110._M_dataplus._M_p) {
          local_80 = (long *)CONCAT44(local_80._4_4_,0xffffffff);
        }
        else {
          local_80 = (long *)CONCAT44(local_80._4_4_,1);
        }
      }
      if (((int)local_110._M_dataplus._M_p <= (int)local_60 || (int)local_80 < 1) &&
         ((-1 < (int)local_80 || (int)local_60 <= (int)local_110._M_dataplus._M_p) &&
          (int)local_80 != 0)) {
        iVar7 = (int)local_110._M_dataplus._M_p - (int)local_60;
        iVar6 = 0;
        if (iVar7 != 0 && (int)local_60 <= (int)local_110._M_dataplus._M_p) {
          iVar6 = iVar7;
        }
        iVar7 = -iVar7;
        if ((int)local_60 <= (int)local_110._M_dataplus._M_p) {
          iVar7 = 0;
        }
        iVar3 = -(int)local_80;
        if (0 < (int)local_80) {
          iVar3 = (int)local_80;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)this_00,(ulong)(iVar7 / iVar3 + iVar6 / iVar3 + 2));
        std::__cxx11::string::_M_assign
                  ((string *)
                   (((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&this_00->_vptr_cmFunctionBlocker)->_M_impl).super__Vector_impl_data.
                   _M_start);
        local_e8._M_dataplus._M_p._0_4_ = (int)local_110._M_dataplus._M_p;
        __gen.step = (int)local_80;
        __gen.cc = (int *)&local_e8;
        __gen._12_4_ = 0;
        std::
        generate<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmForEachCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::__0>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (_Var11._M_head_impl[1]._vptr_cmFunctionBlocker + 4),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   _Var11._M_head_impl[1].StartingContext.Name._M_dataplus._M_p,__gen);
        goto LAB_00470434;
      }
      cmStrCat<char_const(&)[50],int&,char_const(&)[8],int&,char_const(&)[8],int&>
                (&local_e8,(char (*) [50])"called with incorrect range specification: start ",
                 (int *)&local_110,(char (*) [8])", stop ",(int *)&local_60,(char (*) [8])", step ",
                 (int *)&local_80);
      std::__cxx11::string::_M_assign((string *)&status->Error);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,
                        (ulong)(local_e8.field_2._M_allocated_capacity + 1));
      }
      cmSystemTools::s_FatalErrorOccurred = true;
    }
    bVar5 = false;
  }
  if (_Var11._M_head_impl != (cmFunctionBlocker *)0x0) {
    (**(code **)(*(long *)_Var11._M_head_impl + 8))(_Var11._M_head_impl);
  }
  return bVar5;
}

Assistant:

bool cmForEachCommand(std::vector<std::string> const& args,
                      cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }
  auto kwInIter = std::find(args.begin(), args.end(), "IN");
  if (kwInIter != args.end()) {
    return HandleInMode(args, kwInIter, status.GetMakefile());
  }

  // create a function blocker
  auto fb = cm::make_unique<cmForEachFunctionBlocker>(&status.GetMakefile());
  if (args.size() > 1) {
    if (args[1] == "RANGE") {
      int start = 0;
      int stop = 0;
      int step = 0;
      if (args.size() == 3) {
        if (!TryParseInteger(status, args[2], stop)) {
          return false;
        }
      }
      if (args.size() == 4) {
        if (!TryParseInteger(status, args[2], start)) {
          return false;
        }
        if (!TryParseInteger(status, args[3], stop)) {
          return false;
        }
      }
      if (args.size() == 5) {
        if (!TryParseInteger(status, args[2], start)) {
          return false;
        }
        if (!TryParseInteger(status, args[3], stop)) {
          return false;
        }
        if (!TryParseInteger(status, args[4], step)) {
          return false;
        }
      }
      if (step == 0) {
        if (start > stop) {
          step = -1;
        } else {
          step = 1;
        }
      }
      if ((start > stop && step > 0) || (start < stop && step < 0) ||
          step == 0) {
        status.SetError(
          cmStrCat("called with incorrect range specification: start ", start,
                   ", stop ", stop, ", step ", step));
        cmSystemTools::SetFatalErrorOccurred();
        return false;
      }

      // Calculate expected iterations count and reserve enough space
      // in the `fb->Args` vector. The first item is the iteration variable
      // name...
      const std::size_t iter_cnt = 2u +
        static_cast<int>(start < stop) * (stop - start) / std::abs(step) +
        static_cast<int>(start > stop) * (start - stop) / std::abs(step);
      fb->Args.resize(iter_cnt);
      fb->Args.front() = args.front();
      auto cc = start;
      auto generator = [&cc, step]() -> std::string {
        auto result = std::to_string(cc);
        cc += step;
        return result;
      };
      // Fill the `range` vector w/ generated string values
      // (starting from 2nd position)
      std::generate(++fb->Args.begin(), fb->Args.end(), generator);
    } else {
      fb->Args = args;
    }
  } else {
    fb->Args = args;
  }

  fb->SetIterationVarsCount(1u);
  status.GetMakefile().AddFunctionBlocker(std::move(fb));

  return true;
}